

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_file_server.cpp
# Opt level: O1

int module_load(Server *server)

{
  key_type *__k;
  _Alloc_hider _Var1;
  size_type sVar2;
  char *pcVar3;
  int iVar4;
  _Node *p_Var5;
  DIR *__dirp;
  dirent *pdVar6;
  long *plVar7;
  _List_node_base *p_Var8;
  ostream *poVar9;
  mapped_type *pmVar10;
  undefined8 extraout_RAX;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  value_type item;
  string s;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  todo;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_list;
  _List_node_base *local_108;
  _List_node_base *local_100;
  _List_node_base local_f8;
  string local_e8;
  char *local_c8;
  long local_c0;
  char local_b8 [16];
  char *local_a8;
  char *local_a0;
  char local_98 [16];
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  Server *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = server;
  puts("Loading module FileServer...");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50.field_2._M_allocated_capacity._0_4_ = 0x74617473;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x6369;
  local_50._M_string_length = 6;
  local_50.field_2._M_local_buf[6] = '\0';
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node._M_size = 0;
  local_a8 = local_98;
  local_a0 = (char *)0x0;
  local_98[0] = '\0';
  local_88._M_impl._M_node.super__List_node_base._M_prev =
       local_88._M_impl._M_node.super__List_node_base._M_next;
  local_70._M_impl._M_node.super__List_node_base._M_prev =
       local_70._M_impl._M_node.super__List_node_base._M_next;
  p_Var5 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           _M_create_node<std::__cxx11::string_const&>
                     ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                      local_88._M_impl._M_node.super__List_node_base._M_next,&local_50);
  std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
  local_88._M_impl._M_node._M_size = local_88._M_impl._M_node._M_size + 1;
  if (local_88._M_impl._M_node._M_size != 0) {
    do {
      local_c8 = local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,
                 local_88._M_impl._M_node.super__List_node_base._M_prev[1]._M_next,
                 (long)&(local_88._M_impl._M_node.super__List_node_base._M_prev[1]._M_next)->_M_next
                 + (long)&(local_88._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev)->
                          _M_next);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88,(iterator)local_88._M_impl._M_node.super__List_node_base._M_prev);
      __dirp = opendir(local_c8);
      if (__dirp != (DIR *)0x0) {
        while (pdVar6 = readdir(__dirp), pcVar3 = local_a0, pdVar6 != (dirent *)0x0) {
          strlen(pdVar6->d_name);
          std::__cxx11::string::_M_replace((ulong)&local_a8,0,pcVar3,(ulong)pdVar6->d_name);
          iVar4 = std::__cxx11::string::compare((char *)&local_a8);
          if (((iVar4 != 0) &&
              (iVar4 = std::__cxx11::string::compare((char *)&local_a8), iVar4 != 0)) &&
             (*local_a8 != '.')) {
            if (pdVar6->d_type == '\x04') {
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,local_c8,local_c8 + local_c0);
              std::__cxx11::string::append((char *)&local_e8);
              plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_a8);
              local_108 = &local_f8;
              p_Var8 = (_List_node_base *)(plVar7 + 2);
              if ((_List_node_base *)*plVar7 == p_Var8) {
                local_f8._M_next = p_Var8->_M_next;
                local_f8._M_prev = (_List_node_base *)plVar7[3];
              }
              else {
                local_f8._M_next = p_Var8->_M_next;
                local_108 = (_List_node_base *)*plVar7;
              }
              local_100 = (_List_node_base *)plVar7[1];
              *plVar7 = (long)p_Var8;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              p_Var8 = (_List_node_base *)operator_new(0x30);
              p_Var8[1]._M_next = p_Var8 + 2;
              if (local_108 == &local_f8) {
                p_Var8[2]._M_next = local_f8._M_next;
                p_Var8[2]._M_prev = local_f8._M_prev;
              }
              else {
                p_Var8[1]._M_next = local_108;
                p_Var8[2]._M_next = local_f8._M_next;
              }
              p_Var8[1]._M_prev = local_100;
              local_100 = (_List_node_base *)0x0;
              local_f8._M_next = (_List_node_base *)((ulong)local_f8._M_next & 0xffffffffffffff00);
              local_108 = &local_f8;
              std::__detail::_List_node_base::_M_hook(p_Var8);
              local_88._M_impl._M_node._M_size = local_88._M_impl._M_node._M_size + 1;
            }
            else {
              if (pdVar6->d_type != '\b') {
                module_load_cold_1();
                if (local_a8 != local_98) {
                  operator_delete(local_a8);
                }
                std::__cxx11::
                _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_clear(&local_88);
                std::__cxx11::
                _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_clear(&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
                _Unwind_Resume(extraout_RAX);
              }
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,local_c8,local_c8 + local_c0);
              std::__cxx11::string::append((char *)&local_e8);
              plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_a8);
              local_108 = &local_f8;
              p_Var8 = (_List_node_base *)(plVar7 + 2);
              if ((_List_node_base *)*plVar7 == p_Var8) {
                local_f8._M_next = p_Var8->_M_next;
                local_f8._M_prev = (_List_node_base *)plVar7[3];
              }
              else {
                local_f8._M_next = p_Var8->_M_next;
                local_108 = (_List_node_base *)*plVar7;
              }
              local_100 = (_List_node_base *)plVar7[1];
              *plVar7 = (long)p_Var8;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              p_Var8 = (_List_node_base *)operator_new(0x30);
              p_Var8[1]._M_next = p_Var8 + 2;
              if (local_108 == &local_f8) {
                p_Var8[2]._M_next = local_f8._M_next;
                p_Var8[2]._M_prev = local_f8._M_prev;
              }
              else {
                p_Var8[1]._M_next = local_108;
                p_Var8[2]._M_next = local_f8._M_next;
              }
              p_Var8[1]._M_prev = local_100;
              local_100 = (_List_node_base *)0x0;
              local_f8._M_next = (_List_node_base *)((ulong)local_f8._M_next & 0xffffffffffffff00);
              local_108 = &local_f8;
              std::__detail::_List_node_base::_M_hook(p_Var8);
              local_70._M_impl._M_node._M_size = local_70._M_impl._M_node._M_size + 1;
            }
            if (local_108 != &local_f8) {
              operator_delete(local_108);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
          }
        }
        closedir(__dirp);
      }
      if (local_c8 != local_b8) {
        operator_delete(local_c8);
      }
    } while (local_88._M_impl._M_node._M_size != 0);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_70) {
    p_Var8 = local_70._M_impl._M_node.super__List_node_base._M_next;
    do {
      __k = (key_type *)(p_Var8 + 1);
      if (p_Var8[1]._M_prev < (_List_node_base *)0x7) {
        bVar11 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)__k);
        iVar4 = std::__cxx11::string::compare((char *)&local_a8);
        bVar11 = iVar4 == 0;
        if (local_a8 != local_98) {
          operator_delete(local_a8);
        }
      }
      if (bVar11) {
        load_file(&local_e8);
        sVar2 = local_e8._M_string_length;
        _Var1._M_p = local_e8._M_dataplus._M_p;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)p_Var8[1]._M_next,(long)p_Var8[1]._M_prev)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator[](&filename_to_buffer_abi_cxx11_,__k);
        (pmVar10->
        super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super__Head_base<0UL,_const_char_*,_false>._M_head_impl = (char *)sVar2;
        (pmVar10->
        super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).
        super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Head_base<1UL,_long,_false>._M_head_impl = (long)_Var1._M_p;
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar10,0,
                   (char *)(pmVar10->
                           super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).
                           super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .
                           super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .
                           super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                           ._M_head_impl._M_string_length,0x10500d);
      }
      else {
        if (p_Var8[1]._M_prev < (_List_node_base *)0x6) {
          bVar11 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_c8,(ulong)__k);
          iVar4 = std::__cxx11::string::compare((char *)&local_c8);
          bVar11 = iVar4 == 0;
          if (local_c8 != local_b8) {
            operator_delete(local_c8);
          }
        }
        if (bVar11) {
          load_file(&local_e8);
          sVar2 = local_e8._M_string_length;
          _Var1._M_p = local_e8._M_dataplus._M_p;
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)p_Var8[1]._M_next,
                              (long)p_Var8[1]._M_prev);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator[](&filename_to_buffer_abi_cxx11_,__k);
          (pmVar10->
          super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).super__Head_base<0UL,_const_char_*,_false>._M_head_impl = (char *)sVar2;
          (pmVar10->
          super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).
          super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .super__Head_base<1UL,_long,_false>._M_head_impl = (long)_Var1._M_p;
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar10,0,
                     (char *)(pmVar10->
                             super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).
                             super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .
                             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .
                             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                             ._M_head_impl._M_string_length,0x10501c);
        }
        else {
          if (p_Var8[1]._M_prev < (_List_node_base *)0x5) {
            bVar11 = false;
          }
          else {
            std::__cxx11::string::substr((ulong)&local_108,(ulong)__k);
            iVar4 = std::__cxx11::string::compare((char *)&local_108);
            bVar11 = iVar4 == 0;
            if (local_108 != &local_f8) {
              operator_delete(local_108);
            }
          }
          if (bVar11) {
            load_file(&local_e8);
            sVar2 = local_e8._M_string_length;
            _Var1._M_p = local_e8._M_dataplus._M_p;
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)p_Var8[1]._M_next,
                                (long)p_Var8[1]._M_prev);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator[](&filename_to_buffer_abi_cxx11_,__k);
            (pmVar10->
            super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super__Head_base<0UL,_const_char_*,_false>._M_head_impl = (char *)sVar2;
            (pmVar10->
            super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).
            super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super__Head_base<1UL,_long,_false>._M_head_impl = (long)_Var1._M_p;
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar10,0,
                       (char *)(pmVar10->
                               super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).
                               super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .
                               super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .
                               super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                               ._M_head_impl._M_string_length,0x105029);
          }
        }
      }
      p_Var8 = (((_List_impl *)&p_Var8->_M_next)->_M_node).super__List_node_base._M_next;
    } while (p_Var8 != (_List_node_base *)&local_70);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_70);
  local_e8._M_dataplus._M_p = (pointer)http_request_handler;
  std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>::insert
            ((vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_> *)
             local_58,(const_iterator)*(_func_HTTPResponse_ptr_Client_ptr ***)local_58,
             (value_type *)&local_e8);
  puts("Loaded module FileServer");
  return 0;
}

Assistant:

int module_load(Server *server) {
    printf("Loading module FileServer...\n");
    load_file_into_mem();
    Server::insert_to_front_of_hook(server->http_request_hook, &http_request_handler);
    printf("Loaded module FileServer\n");
    return 0;
}